

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O2

void __thiscall MxxImpl_CustomOp_Test::TestBody(MxxImpl_CustomOp_Test *this)

{
  char *pcVar1;
  AssertHelper local_80;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  AssertionResult gtest_ar;
  custom_op<int,_true> o;
  
  mxx::custom_op<int,true>::custom_op<std::plus<int>>((custom_op<int,true> *)&o);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&ompi_mpi_int;
  local_80.data_ = (AssertHelperData *)o.m_type_copy;
  testing::internal::CmpHelperEQ<ompi_datatype_t*,ompi_datatype_t*>
            ((internal *)&gtest_ar,
             "(static_cast<MPI_Datatype> (static_cast<void *> (&(ompi_mpi_int))))","o.get_type()",
             (ompi_datatype_t **)&local_78,(ompi_datatype_t **)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x25,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&ompi_mpi_op_sum;
  local_80.data_ = (AssertHelperData *)o.m_op;
  testing::internal::CmpHelperEQ<ompi_op_t*,ompi_op_t*>
            ((internal *)&gtest_ar,
             "(static_cast<MPI_Op> (static_cast<void *> (&(ompi_mpi_op_sum))))","o.get_op()",
             (ompi_op_t **)&local_78,(ompi_op_t **)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x26,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mxx::custom_op<int,_true>::~custom_op(&o);
  mxx::custom_op<double,true>::custom_op<std::multiplies<double>>((custom_op<double,true> *)&o);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&ompi_mpi_double;
  local_80.data_ = (AssertHelperData *)o.m_type_copy;
  testing::internal::CmpHelperEQ<ompi_datatype_t*,ompi_datatype_t*>
            ((internal *)&gtest_ar,
             "(static_cast<MPI_Datatype> (static_cast<void *> (&(ompi_mpi_double))))","o.get_type()"
             ,(ompi_datatype_t **)&local_78,(ompi_datatype_t **)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x2b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&ompi_mpi_op_prod;
  local_80.data_ = (AssertHelperData *)o.m_op;
  testing::internal::CmpHelperEQ<ompi_op_t*,ompi_op_t*>
            ((internal *)&gtest_ar,
             "(static_cast<MPI_Op> (static_cast<void *> (&(ompi_mpi_op_prod))))","o.get_op()",
             (ompi_op_t **)&local_78,(ompi_op_t **)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x2c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mxx::custom_op<double,_true>::~custom_op((custom_op<double,_true> *)&o);
  mxx::custom_op<char,true>::custom_op<std::bit_or<char>>((custom_op<char,true> *)&o);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&ompi_mpi_char;
  local_80.data_ = (AssertHelperData *)o.m_type_copy;
  testing::internal::CmpHelperEQ<ompi_datatype_t*,ompi_datatype_t*>
            ((internal *)&gtest_ar,
             "(static_cast<MPI_Datatype> (static_cast<void *> (&(ompi_mpi_char))))","o.get_type()",
             (ompi_datatype_t **)&local_78,(ompi_datatype_t **)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x31,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&ompi_mpi_op_bor;
  local_80.data_ = (AssertHelperData *)o.m_op;
  testing::internal::CmpHelperEQ<ompi_op_t*,ompi_op_t*>
            ((internal *)&gtest_ar,
             "(static_cast<MPI_Op> (static_cast<void *> (&(ompi_mpi_op_bor))))","o.get_op()",
             (ompi_op_t **)&local_78,(ompi_op_t **)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x32,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mxx::custom_op<char,_true>::~custom_op((custom_op<char,_true> *)&o);
  mxx::custom_op<long,true>::custom_op<std::bit_xor<long>>((custom_op<long,true> *)&o);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&ompi_mpi_long;
  local_80.data_ = (AssertHelperData *)o.m_type_copy;
  testing::internal::CmpHelperEQ<ompi_datatype_t*,ompi_datatype_t*>
            ((internal *)&gtest_ar,
             "(static_cast<MPI_Datatype> (static_cast<void *> (&(ompi_mpi_long))))","o.get_type()",
             (ompi_datatype_t **)&local_78,(ompi_datatype_t **)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x37,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&ompi_mpi_op_bxor;
  local_80.data_ = (AssertHelperData *)o.m_op;
  testing::internal::CmpHelperEQ<ompi_op_t*,ompi_op_t*>
            ((internal *)&gtest_ar,
             "(static_cast<MPI_Op> (static_cast<void *> (&(ompi_mpi_op_bxor))))","o.get_op()",
             (ompi_op_t **)&local_78,(ompi_op_t **)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x38,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mxx::custom_op<long,_true>::~custom_op((custom_op<long,_true> *)&o);
  mxx::custom_op<unsigned_char,true>::custom_op<std::bit_and<unsigned_char>>
            ((custom_op<unsigned_char,true> *)&o);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &ompi_mpi_unsigned_char;
  local_80.data_ = (AssertHelperData *)o.m_type_copy;
  testing::internal::CmpHelperEQ<ompi_datatype_t*,ompi_datatype_t*>
            ((internal *)&gtest_ar,
             "(static_cast<MPI_Datatype> (static_cast<void *> (&(ompi_mpi_unsigned_char))))",
             "o.get_type()",(ompi_datatype_t **)&local_78,(ompi_datatype_t **)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x3d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&ompi_mpi_op_band;
  local_80.data_ = (AssertHelperData *)o.m_op;
  testing::internal::CmpHelperEQ<ompi_op_t*,ompi_op_t*>
            ((internal *)&gtest_ar,
             "(static_cast<MPI_Op> (static_cast<void *> (&(ompi_mpi_op_band))))","o.get_op()",
             (ompi_op_t **)&local_78,(ompi_op_t **)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x3e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mxx::custom_op<unsigned_char,_true>::~custom_op((custom_op<unsigned_char,_true> *)&o);
  mxx::custom_op<unsigned_int,true>::custom_op<std::logical_or<unsigned_int>>
            ((custom_op<unsigned_int,true> *)&o);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&ompi_mpi_unsigned
  ;
  local_80.data_ = (AssertHelperData *)o.m_type_copy;
  testing::internal::CmpHelperEQ<ompi_datatype_t*,ompi_datatype_t*>
            ((internal *)&gtest_ar,
             "(static_cast<MPI_Datatype> (static_cast<void *> (&(ompi_mpi_unsigned))))",
             "o.get_type()",(ompi_datatype_t **)&local_78,(ompi_datatype_t **)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x43,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&ompi_mpi_op_lor;
  local_80.data_ = (AssertHelperData *)o.m_op;
  testing::internal::CmpHelperEQ<ompi_op_t*,ompi_op_t*>
            ((internal *)&gtest_ar,
             "(static_cast<MPI_Op> (static_cast<void *> (&(ompi_mpi_op_lor))))","o.get_op()",
             (ompi_op_t **)&local_78,(ompi_op_t **)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x44,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mxx::custom_op<unsigned_int,_true>::~custom_op((custom_op<unsigned_int,_true> *)&o);
  mxx::custom_op<unsigned_short,true>::custom_op<std::logical_and<unsigned_short>>
            ((custom_op<unsigned_short,true> *)&o);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &ompi_mpi_unsigned_short;
  local_80.data_ = (AssertHelperData *)o.m_type_copy;
  testing::internal::CmpHelperEQ<ompi_datatype_t*,ompi_datatype_t*>
            ((internal *)&gtest_ar,
             "(static_cast<MPI_Datatype> (static_cast<void *> (&(ompi_mpi_unsigned_short))))",
             "o.get_type()",(ompi_datatype_t **)&local_78,(ompi_datatype_t **)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x49,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&ompi_mpi_op_land;
  local_80.data_ = (AssertHelperData *)o.m_op;
  testing::internal::CmpHelperEQ<ompi_op_t*,ompi_op_t*>
            ((internal *)&gtest_ar,
             "(static_cast<MPI_Op> (static_cast<void *> (&(ompi_mpi_op_land))))","o.get_op()",
             (ompi_op_t **)&local_78,(ompi_op_t **)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x4a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mxx::custom_op<unsigned_short,_true>::~custom_op((custom_op<unsigned_short,_true> *)&o);
  mxx::custom_op<float,true>::custom_op<float_const&(*)(float_const&,float_const&)>
            ((custom_op<float,true> *)&o,std::min<float>);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&ompi_mpi_float;
  local_80.data_ = (AssertHelperData *)o.m_type_copy;
  testing::internal::CmpHelperEQ<ompi_datatype_t*,ompi_datatype_t*>
            ((internal *)&gtest_ar,
             "(static_cast<MPI_Datatype> (static_cast<void *> (&(ompi_mpi_float))))","o.get_type()",
             (ompi_datatype_t **)&local_78,(ompi_datatype_t **)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x4f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&ompi_mpi_op_min;
  local_80.data_ = (AssertHelperData *)o.m_op;
  testing::internal::CmpHelperEQ<ompi_op_t*,ompi_op_t*>
            ((internal *)&gtest_ar,
             "(static_cast<MPI_Op> (static_cast<void *> (&(ompi_mpi_op_min))))","o.get_op()",
             (ompi_op_t **)&local_78,(ompi_op_t **)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x50,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mxx::custom_op<float,_true>::~custom_op((custom_op<float,_true> *)&o);
  mxx::custom_op<int,true>::custom_op<int_const&(*)(int_const&,int_const&)>
            ((custom_op<int,true> *)&o,std::max<int>);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&ompi_mpi_int;
  local_80.data_ = (AssertHelperData *)o.m_type_copy;
  testing::internal::CmpHelperEQ<ompi_datatype_t*,ompi_datatype_t*>
            ((internal *)&gtest_ar,
             "(static_cast<MPI_Datatype> (static_cast<void *> (&(ompi_mpi_int))))","o.get_type()",
             (ompi_datatype_t **)&local_78,(ompi_datatype_t **)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x54,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&ompi_mpi_op_max;
  local_80.data_ = (AssertHelperData *)o.m_op;
  testing::internal::CmpHelperEQ<ompi_op_t*,ompi_op_t*>
            ((internal *)&gtest_ar,
             "(static_cast<MPI_Op> (static_cast<void *> (&(ompi_mpi_op_max))))","o.get_op()",
             (ompi_op_t **)&local_78,(ompi_op_t **)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x55,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mxx::custom_op<int,_true>::~custom_op(&o);
  mxx::custom_op<int,true>::custom_op<mxx::max<int>>((custom_op<int,true> *)&o);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&ompi_mpi_int;
  local_80.data_ = (AssertHelperData *)o.m_type_copy;
  testing::internal::CmpHelperEQ<ompi_datatype_t*,ompi_datatype_t*>
            ((internal *)&gtest_ar,
             "(static_cast<MPI_Datatype> (static_cast<void *> (&(ompi_mpi_int))))","o.get_type()",
             (ompi_datatype_t **)&local_78,(ompi_datatype_t **)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x5a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&ompi_mpi_op_max;
  local_80.data_ = (AssertHelperData *)o.m_op;
  testing::internal::CmpHelperEQ<ompi_op_t*,ompi_op_t*>
            ((internal *)&gtest_ar,
             "(static_cast<MPI_Op> (static_cast<void *> (&(ompi_mpi_op_max))))","o.get_op()",
             (ompi_op_t **)&local_78,(ompi_op_t **)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x5b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mxx::custom_op<int,_true>::~custom_op(&o);
  mxx::custom_op<int,true>::custom_op<mxx::min<int>>((custom_op<int,true> *)&o);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&ompi_mpi_int;
  local_80.data_ = (AssertHelperData *)o.m_type_copy;
  testing::internal::CmpHelperEQ<ompi_datatype_t*,ompi_datatype_t*>
            ((internal *)&gtest_ar,
             "(static_cast<MPI_Datatype> (static_cast<void *> (&(ompi_mpi_int))))","o.get_type()",
             (ompi_datatype_t **)&local_78,(ompi_datatype_t **)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x60,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&ompi_mpi_op_min;
  local_80.data_ = (AssertHelperData *)o.m_op;
  testing::internal::CmpHelperEQ<ompi_op_t*,ompi_op_t*>
            ((internal *)&gtest_ar,
             "(static_cast<MPI_Op> (static_cast<void *> (&(ompi_mpi_op_min))))","o.get_op()",
             (ompi_op_t **)&local_78,(ompi_op_t **)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x61,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mxx::custom_op<int,_true>::~custom_op(&o);
  return;
}

Assistant:

TEST(MxxImpl, CustomOp) {
    // test C++ functors (postive tests)
    {
        std::plus<int> x;
        mxx::custom_op<int> o(x);
        EXPECT_EQ(MPI_INT, o.get_type());
        EXPECT_EQ(MPI_SUM, o.get_op());
    }
    {
        std::multiplies<double> x;
        mxx::custom_op<double> o(x);
        EXPECT_EQ(MPI_DOUBLE, o.get_type());
        EXPECT_EQ(MPI_PROD, o.get_op());
    }
    {
        std::bit_or<char> x;
        mxx::custom_op<char> o(x);
        EXPECT_EQ(MPI_CHAR, o.get_type());
        EXPECT_EQ(MPI_BOR, o.get_op());
    }
    {
        std::bit_xor<long> x;
        mxx::custom_op<long> o(x);
        EXPECT_EQ(MPI_LONG, o.get_type());
        EXPECT_EQ(MPI_BXOR, o.get_op());
    }
    {
        std::bit_and<unsigned char> x;
        mxx::custom_op<unsigned char> o(x);
        EXPECT_EQ(MPI_UNSIGNED_CHAR, o.get_type());
        EXPECT_EQ(MPI_BAND, o.get_op());
    }
    {
        std::logical_or<unsigned int> x;
        mxx::custom_op<unsigned int> o(x);
        EXPECT_EQ(MPI_UNSIGNED, o.get_type());
        EXPECT_EQ(MPI_LOR, o.get_op());
    }
    {
        std::logical_and<unsigned short> x;
        mxx::custom_op<unsigned short> o(x);
        EXPECT_EQ(MPI_UNSIGNED_SHORT, o.get_type());
        EXPECT_EQ(MPI_LAND, o.get_op());
    }
    // test std::min and std::max
    {
        mxx::custom_op<float> o(static_cast<const float&(*)(const float&, const float&)>(&std::min<float>));
        EXPECT_EQ(MPI_FLOAT, o.get_type());
        EXPECT_EQ(MPI_MIN, o.get_op());
    }
    {
        mxx::custom_op<int> o(static_cast<const int&(*)(const int&, const int&)>(&std::max<int>));
        EXPECT_EQ(MPI_INT, o.get_type());
        EXPECT_EQ(MPI_MAX, o.get_op());
    }
    {
        mxx::max<int> x;
        mxx::custom_op<int> o(x);
        EXPECT_EQ(MPI_INT, o.get_type());
        EXPECT_EQ(MPI_MAX, o.get_op());
    }
    {
        mxx::min<int> x;
        mxx::custom_op<int> o(x);
        EXPECT_EQ(MPI_INT, o.get_type());
        EXPECT_EQ(MPI_MIN, o.get_op());
    }
}